

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

bool __thiscall
cmFindPackageCommand::ReadListFile(cmFindPackageCommand *this,string *f,PolicyScopeRule psr)

{
  bool bVar1;
  SetGlobalTargetImportScope globScope;
  string e;
  SetGlobalTargetImportScope local_a8;
  string local_98;
  cmAlphaNum local_78;
  cmAlphaNum local_48;
  
  bVar1 = this->PolicyScope;
  cmMakefile::SetGlobalTargetImportScope::SetGlobalTargetImportScope
            (&local_a8,(this->super_cmFindCommon).Makefile,(uint)this->GlobalScope);
  bVar1 = cmMakefile::ReadDependentFile
                    ((this->super_cmFindCommon).Makefile,f,(bool)(bVar1 ^ 1U | psr == NoPolicyScope)
                    );
  if (!bVar1) {
    local_48.View_._M_len = 0x1f;
    local_48.View_._M_str = "Error reading CMake code from \"";
    local_78.View_._M_str = (f->_M_dataplus)._M_p;
    local_78.View_._M_len = f->_M_string_length;
    cmStrCat<char[3]>(&local_98,&local_48,&local_78,(char (*) [3])0x5cc634);
    cmFindCommon::SetError(&this->super_cmFindCommon,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  if (local_a8.Set == true) {
    (local_a8.Makefile)->CurrentImportedTargetScope = Local;
  }
  return bVar1;
}

Assistant:

bool cmFindPackageCommand::ReadListFile(const std::string& f,
                                        const PolicyScopeRule psr)
{
  const bool noPolicyScope = !this->PolicyScope || psr == NoPolicyScope;

  using ITScope = cmMakefile::ImportedTargetScope;
  ITScope scope = this->GlobalScope ? ITScope::Global : ITScope::Local;
  cmMakefile::SetGlobalTargetImportScope globScope(this->Makefile, scope);

  if (this->Makefile->ReadDependentFile(f, noPolicyScope)) {
    return true;
  }
  std::string const e = cmStrCat("Error reading CMake code from \"", f, "\".");
  this->SetError(e);
  return false;
}